

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::gen_index_which
          (CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,int forward,
          int count_only,vm_rcdesc *rc)

{
  vm_val_t *funcptr;
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  vm_obj_id_t vVar6;
  vm_obj_id_t vVar7;
  bool bVar8;
  
  if ((gen_index_which(unsigned_int,vm_val_t*,unsigned_int*,int,int,vm_rcdesc*)::desc == '\0') &&
     (iVar3 = __cxa_guard_acquire(&gen_index_which(unsigned_int,vm_val_t*,unsigned_int*,int,int,vm_rcdesc*)
                                   ::desc), iVar3 != 0)) {
    gen_index_which::desc.min_argc_ = 1;
    gen_index_which::desc.opt_argc_ = 0;
    gen_index_which::desc.varargs_ = 0;
    __cxa_guard_release(&gen_index_which(unsigned_int,vm_val_t*,unsigned_int*,int,int,vm_rcdesc*)::
                         desc);
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&gen_index_which::desc);
  pvVar2 = sp_;
  if (iVar3 != 0) {
    return 1;
  }
  funcptr = sp_ + -1;
  pvVar1 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar1 = VM_OBJ;
  (pvVar2->val).obj = self;
  retval->typ = VM_NIL;
  uVar4 = (ulong)*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
  vVar6 = 0;
  bVar8 = forward == 0;
  uVar5 = 0;
  if (bVar8) {
    uVar5 = uVar4;
  }
  vVar7 = ((int)uVar5 - (uint)bVar8) + 1;
  do {
    if (forward == 0) {
      if (uVar5 == 0) {
LAB_0027f0c1:
        sp_ = sp_ + -2;
        if (count_only == 0) {
          return 1;
        }
        retval->typ = VM_INT;
        (retval->val).obj = vVar6;
        return 1;
      }
    }
    else if (uVar4 <= uVar5) goto LAB_0027f0c1;
    push_element(this,uVar5 - bVar8);
    CVmRun::call_func_ptr(&G_interpreter_X,funcptr,1,rc,0);
    if ((r0_.typ != VM_NIL) && ((r0_.typ != VM_INT || (r0_.val.obj != 0)))) {
      if (count_only == 0) {
        retval->typ = VM_INT;
        (retval->val).obj = vVar7;
        sp_ = sp_ + -2;
        return 1;
      }
      vVar6 = vVar6 + 1;
    }
    uVar5 = (uVar5 - bVar8) + (ulong)!bVar8;
    vVar7 = vVar7 + ((uint)!bVar8 - (uint)bVar8);
  } while( true );
}

Assistant:

int CVmObjVector::gen_index_which(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                  uint *argc, int forward, int count_only,
                                  vm_rcdesc *rc)
{
    const vm_val_t *func_val;
    size_t cnt;
    size_t idx;
    int val_cnt;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while working to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* presume we won't find a matching element */
    retval->set_nil();
    val_cnt = 0;

    /* get the number of elements to visit */
    cnt = get_element_count();

    /* start at the first or last element, depending on direction */
    idx = (forward ? 0 : cnt);

    /*
     *   Go through each element of our vector, and invoke the callback on
     *   each element, looking for the first one that returns true.  
     */
    for (;;)
    {
        /* if we've reached the last element, we can stop looking */
        if (forward ? idx >= cnt : idx == 0)
            break;

        /* if we're going backwards, decrement the index */
        if (!forward)
            --idx;

        /* push the element as the callback's argument */
        push_element(vmg_ idx);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, rc, 0);

        /* 
         *   if the callback returned true, we've found the element we're
         *   looking for 
         */
        if (G_interpreter->get_r0()->typ == VM_NIL
            || (G_interpreter->get_r0()->typ == VM_INT
                && G_interpreter->get_r0()->val.intval == 0))
        {
            /* nil or zero - this one failed the test, so keep looking */
        }
        else
        {
            /* it passed the test - check what we're doing */
            if (count_only)
            {
                /* we only want the count */
                ++val_cnt;
            }
            else
            {
                /* we want the (1-based) index - return it */
                retval->set_int(idx + 1);
            
                /* found it - no need to keep looking */
                break;
            }
        }

        /* if we're going forwards, increment the index */
        if (forward)
            ++idx;
    }
    
    /* discard our gc protection (self) and our arguments */
    G_stk->discard(2);

    /* return the count if desired */
    if (count_only)
        retval->set_int(val_cnt);
    
    /* handled */
    return TRUE;
}